

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::BeginChildEx(char *name,ImGuiID id,ImVec2 *size_arg,bool border,ImGuiWindowFlags flags)

{
  uint uVar1;
  ImGuiWindow *pIVar2;
  ImGuiWindow *window;
  undefined1 auVar3 [16];
  ImGuiContext *pIVar4;
  bool bVar5;
  ImGuiContext *g;
  undefined4 uVar6;
  ImVec2 IVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  int iVar11;
  char title [256];
  char local_138 [264];
  
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  uVar1 = pIVar2->Flags;
  IVar7 = GetContentRegionAvail();
  iVar10 = (int)(*size_arg).x;
  iVar11 = (int)(*size_arg).y;
  fVar8 = (float)iVar10;
  fVar9 = (float)iVar11;
  if ((iVar10 < 1) && (fVar8 = IVar7.x + fVar8, fVar8 <= 4.0)) {
    fVar8 = 4.0;
  }
  if ((fVar9 <= 0.0) && (fVar9 = IVar7.y + fVar9, fVar9 <= 4.0)) {
    fVar9 = 4.0;
  }
  IVar7.y = fVar9;
  IVar7.x = fVar8;
  auVar3._4_4_ = -(uint)(iVar10 == 0);
  auVar3._0_4_ = -(uint)(iVar10 == 0);
  auVar3._8_4_ = -(uint)(iVar11 == 0);
  auVar3._12_4_ = -(uint)(iVar11 == 0);
  uVar6 = movmskpd((int)size_arg,auVar3);
  *(byte *)&(pIVar4->NextWindowData).Flags = (byte)(pIVar4->NextWindowData).Flags | 2;
  (pIVar4->NextWindowData).SizeVal = IVar7;
  (pIVar4->NextWindowData).SizeCond = 1;
  if (name == (char *)0x0) {
    ImFormatString(local_138,0x100,"%s/%08X",pIVar2->Name,id);
  }
  else {
    ImFormatString(local_138,0x100,"%s/%s_%08X",pIVar2->Name,name,id);
  }
  fVar9 = (pIVar4->Style).ChildBorderSize;
  if (!border) {
    (pIVar4->Style).ChildBorderSize = 0.0;
  }
  bVar5 = Begin(local_138,(bool *)0x0,uVar1 & 4 | flags | 0x1200103);
  (pIVar4->Style).ChildBorderSize = fVar9;
  window = pIVar4->CurrentWindow;
  window->ChildId = id;
  window->AutoFitChildAxises = (ImS8)uVar6;
  if (window->BeginCount == 1) {
    (pIVar2->DC).CursorPos = window->Pos;
  }
  if (((((uint)flags >> 0x17 & 1) == 0) && (pIVar4->NavActivateId == id)) &&
     (((window->DC).NavLayerActiveMask != 0 || ((window->DC).NavHasScroll == true)))) {
    FocusWindow(window);
    NavInitWindow(window,false);
    SetActiveID(id + 1,window);
    pIVar4->ActiveIdSource = ImGuiInputSource_Nav;
  }
  return bVar5;
}

Assistant:

bool ImGui::BeginChildEx(const char* name, ImGuiID id, const ImVec2& size_arg, bool border, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = g.CurrentWindow;

    flags |= ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_NoDocking;
    flags |= (parent_window->Flags & ImGuiWindowFlags_NoMove);  // Inherit the NoMove flag

    // Size
    const ImVec2 content_avail = GetContentRegionAvail();
    ImVec2 size = ImFloor(size_arg);
    const int auto_fit_axises = ((size.x == 0.0f) ? (1 << ImGuiAxis_X) : 0x00) | ((size.y == 0.0f) ? (1 << ImGuiAxis_Y) : 0x00);
    if (size.x <= 0.0f)
        size.x = ImMax(content_avail.x + size.x, 4.0f); // Arbitrary minimum child size (0.0f causing too much issues)
    if (size.y <= 0.0f)
        size.y = ImMax(content_avail.y + size.y, 4.0f);
    SetNextWindowSize(size);

    // Build up name. If you need to append to a same child from multiple location in the ID stack, use BeginChild(ImGuiID id) with a stable value.
    char title[256];
    if (name)
        ImFormatString(title, IM_ARRAYSIZE(title), "%s/%s_%08X", parent_window->Name, name, id);
    else
        ImFormatString(title, IM_ARRAYSIZE(title), "%s/%08X", parent_window->Name, id);

    const float backup_border_size = g.Style.ChildBorderSize;
    if (!border)
        g.Style.ChildBorderSize = 0.0f;
    bool ret = Begin(title, NULL, flags);
    g.Style.ChildBorderSize = backup_border_size;

    ImGuiWindow* child_window = g.CurrentWindow;
    child_window->ChildId = id;
    child_window->AutoFitChildAxises = (ImS8)auto_fit_axises;

    // Set the cursor to handle case where the user called SetNextWindowPos()+BeginChild() manually.
    // While this is not really documented/defined, it seems that the expected thing to do.
    if (child_window->BeginCount == 1)
        parent_window->DC.CursorPos = child_window->Pos;

    // Process navigation-in immediately so NavInit can run on first frame
    if (g.NavActivateId == id && !(flags & ImGuiWindowFlags_NavFlattened) && (child_window->DC.NavLayerActiveMask != 0 || child_window->DC.NavHasScroll))
    {
        FocusWindow(child_window);
        NavInitWindow(child_window, false);
        SetActiveID(id + 1, child_window); // Steal ActiveId with another arbitrary id so that key-press won't activate child item
        g.ActiveIdSource = ImGuiInputSource_Nav;
    }
    return ret;
}